

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UChar * ures_getStringByIndex_63
                  (UResourceBundle *resB,int32_t indexS,int32_t *len,UErrorCode *status)

{
  UBool UVar1;
  Resource RVar2;
  char *pcStack_38;
  Resource r;
  char *key;
  UErrorCode *status_local;
  int32_t *len_local;
  UResourceBundle *pUStack_18;
  int32_t indexS_local;
  UResourceBundle *resB_local;
  
  pcStack_38 = (char *)0x0;
  if ((status == (UErrorCode *)0x0) ||
     (key = (char *)status, status_local = len, len_local._4_4_ = indexS, pUStack_18 = resB,
     UVar1 = U_FAILURE(*status), UVar1 != '\0')) {
    return (UChar *)0x0;
  }
  if (pUStack_18 == (UResourceBundle *)0x0) {
    key[0] = '\x01';
    key[1] = '\0';
    key[2] = '\0';
    key[3] = '\0';
    return (UChar *)0x0;
  }
  if ((len_local._4_4_ < 0) || (pUStack_18->fSize <= len_local._4_4_)) {
    key[0] = '\x02';
    key[1] = '\0';
    key[2] = '\0';
    key[3] = '\0';
    goto LAB_0048e6c3;
  }
  switch(pUStack_18->fRes >> 0x1c) {
  case 0:
  case 6:
    resB_local = (UResourceBundle *)
                 res_getString_63(&pUStack_18->fResData,pUStack_18->fRes,status_local);
    break;
  case 1:
  case 7:
  case 0xe:
    key[0] = '\x11';
    key[1] = '\0';
    key[2] = '\0';
    key[3] = '\0';
    goto LAB_0048e6c3;
  case 2:
  case 4:
  case 5:
    RVar2 = res_getTableItemByIndex_63
                      (&pUStack_18->fResData,pUStack_18->fRes,len_local._4_4_,
                       &stack0xffffffffffffffc8);
    resB_local = (UResourceBundle *)
                 ures_getStringWithAlias
                           (pUStack_18,RVar2,len_local._4_4_,status_local,(UErrorCode *)key);
    break;
  case 3:
    resB_local = (UResourceBundle *)
                 ures_getStringWithAlias
                           (pUStack_18,pUStack_18->fRes,len_local._4_4_,status_local,
                            (UErrorCode *)key);
    break;
  case 8:
  case 9:
    RVar2 = res_getArrayItem_63(&pUStack_18->fResData,pUStack_18->fRes,len_local._4_4_);
    resB_local = (UResourceBundle *)
                 ures_getStringWithAlias
                           (pUStack_18,RVar2,len_local._4_4_,status_local,(UErrorCode *)key);
    break;
  default:
    key[0] = '\x05';
    key[1] = '\0';
    key[2] = '\0';
    key[3] = '\0';
LAB_0048e6c3:
    resB_local = (UResourceBundle *)0x0;
  }
  return (UChar *)resB_local;
}

Assistant:

U_CAPI const UChar* U_EXPORT2 ures_getStringByIndex(const UResourceBundle *resB, int32_t indexS, int32_t* len, UErrorCode *status) {
    const char* key = NULL;
    Resource r = RES_BOGUS;

    if (status==NULL || U_FAILURE(*status)) {
        return NULL;
    }
    if(resB == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if(indexS >= 0 && resB->fSize > indexS) {
        switch(RES_GET_TYPE(resB->fRes)) {
        case URES_STRING:
        case URES_STRING_V2:
            return res_getString(&(resB->fResData), resB->fRes, len);
        case URES_TABLE:
        case URES_TABLE16:
        case URES_TABLE32:
            r = res_getTableItemByIndex(&(resB->fResData), resB->fRes, indexS, &key);
            if(r == RES_BOGUS && resB->fHasFallback) {
                /* TODO: do the fallback */
            }
            return ures_getStringWithAlias(resB, r, indexS, len, status);
        case URES_ARRAY:
        case URES_ARRAY16:
            r = res_getArrayItem(&(resB->fResData), resB->fRes, indexS);
            if(r == RES_BOGUS && resB->fHasFallback) {
                /* TODO: do the fallback */
            }
            return ures_getStringWithAlias(resB, r, indexS, len, status);
        case URES_ALIAS:
            return ures_getStringWithAlias(resB, resB->fRes, indexS, len, status);
        case URES_INT:
        case URES_BINARY:
        case URES_INT_VECTOR:
            *status = U_RESOURCE_TYPE_MISMATCH;
            break;
        default:
          /* must not occur */
          *status = U_INTERNAL_PROGRAM_ERROR;
          break;
        }
    } else {
        *status = U_MISSING_RESOURCE_ERROR;
    }
    return NULL;
}